

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O0

void secp256k1_ecmult_table_get_ge_lambda
               (secp256k1_ge *r,secp256k1_ge *pre,secp256k1_fe *x,int n,int w)

{
  int w_local;
  int n_local;
  secp256k1_fe *x_local;
  secp256k1_ge *pre_local;
  secp256k1_ge *r_local;
  
  if (n < 1) {
    secp256k1_ge_set_xy(r,x + (-1 - n) / 2,&pre[(-1 - n) / 2].y);
    secp256k1_fe_negate(&r->y,&r->y,1);
  }
  else {
    secp256k1_ge_set_xy(r,x + (n + -1) / 2,&pre[(n + -1) / 2].y);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_ecmult_table_get_ge_lambda(secp256k1_ge *r, const secp256k1_ge *pre, const secp256k1_fe *x, int n, int w) {
    SECP256K1_ECMULT_TABLE_VERIFY(n,w)
    if (n > 0) {
        secp256k1_ge_set_xy(r, &x[(n-1)/2], &pre[(n-1)/2].y);
    } else {
        secp256k1_ge_set_xy(r, &x[(-n-1)/2], &pre[(-n-1)/2].y);
        secp256k1_fe_negate(&(r->y), &(r->y), 1);
    }
}